

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O2

void RecordTextureColors(FTexture *pic,BYTE *usedcolors)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  ushort *in_RAX;
  undefined4 extraout_var;
  uint uVar4;
  long lVar5;
  Span *spans;
  ushort *local_28;
  
  uVar4 = (uint)pic->Width;
  local_28 = in_RAX;
  while (0 < (int)uVar4) {
    uVar4 = uVar4 - 1;
    iVar3 = (*pic->_vptr_FTexture[2])(pic,(ulong)uVar4,&local_28);
    for (; uVar1 = local_28[1], uVar1 != 0; local_28 = local_28 + 2) {
      uVar2 = *local_28;
      lVar5 = 0;
      do {
        usedcolors[*(byte *)((ulong)uVar2 + CONCAT44(extraout_var,iVar3) + lVar5)] = '\x01';
        lVar5 = lVar5 + 1;
      } while ((uint)uVar1 != (uint)lVar5);
    }
  }
  return;
}

Assistant:

void RecordTextureColors (FTexture *pic, BYTE *usedcolors)
{
	int x;

	for (x = pic->GetWidth() - 1; x >= 0; x--)
	{
		const FTexture::Span *spans;
		const BYTE *column = pic->GetColumn (x, &spans);

		while (spans->Length != 0)
		{
			const BYTE *source = column + spans->TopOffset;
			int count = spans->Length;

			do
			{
				usedcolors[*source++] = 1;
			} while (--count);

			spans++;
		}
	}
}